

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QCborArray *a)

{
  int *piVar1;
  QCborContainerPrivate *pQVar2;
  Stream *pSVar3;
  QDebug *pQVar4;
  long *in_RDX;
  char *t;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  QCborValueConstRef local_68;
  QDebugStateSaver saver;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)a);
  *(undefined1 *)&(((a->d).d.ptr)->elements).d.ptr = 0;
  QDebug::operator<<((QDebug *)a,"QCborArray{");
  pQVar2 = (QCborContainerPrivate *)*in_RDX;
  if (pQVar2 == (QCborContainerPrivate *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (pQVar2->elements).d.size;
  }
  t = "";
  for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
    local_68.d = pQVar2;
    local_68.i = lVar6;
    pQVar4 = QDebug::operator<<((QDebug *)a,t);
    local_78._0_8_ = pQVar4->stream;
    ((Stream *)local_78._0_8_)->ref = ((Stream *)local_78._0_8_)->ref + 1;
    QCborValueConstRef::concrete(&local_50,&local_68);
    operator<<((Stream *)(local_78 + 8),(QCborValue *)local_78);
    QDebug::~QDebug((QDebug *)(local_78 + 8));
    QCborValue::~QCborValue((QCborValue *)&local_50);
    QDebug::~QDebug((QDebug *)local_78);
    t = ", ";
  }
  pQVar4 = QDebug::operator<<((QDebug *)a,'}');
  pSVar3 = pQVar4->stream;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar3;
  piVar1 = &pSVar3->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborArray &a)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborArray{";
    const char *comma = "";
    for (auto v : a) {
        dbg << comma << v;
        comma = ", ";
    }
    return dbg << '}';
}